

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::internal::KeyMapBase<bool>::MergeIntoEmpty
          (KeyMapBase<bool> *this,NodeBase *head,size_t num_nodes)

{
  NodeBase *pNVar1;
  uint uVar2;
  map_index_t mVar3;
  Nonnull<const_char_*> failure_msg;
  size_type sVar4;
  int line;
  KeyNode *node;
  LogMessageFatal local_30;
  unsigned_long local_20;
  
  local_30.super_LogMessage._0_8_ = ZEXT48((this->super_UntypedMapBase).num_elements_);
  local_20 = 0;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_30,&local_20,"size() == size_t{0}");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_20 = 0;
    local_30.super_LogMessage._0_8_ = num_nodes;
    failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_long,unsigned_long>
                            ((unsigned_long *)&local_30,&local_20,"num_nodes != size_t{0}");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      sVar4 = CalculateCapacityForSize(num_nodes);
      uVar2 = (uint)sVar4;
      if ((this->super_UntypedMapBase).num_buckets_ != uVar2) {
        mVar3 = 2;
        if (2 < uVar2) {
          mVar3 = uVar2;
        }
        Resize(this,mVar3);
      }
      (this->super_UntypedMapBase).num_elements_ = (map_index_t)num_nodes;
      AssertLoadFactor(this);
      while (head != (NodeBase *)0x0) {
        pNVar1 = head->next;
        mVar3 = BucketNumber(this,(ViewType_conflict1)(*(byte *)&head[1].next & 1));
        InsertUnique(this,mVar3,(KeyNode *)head);
        head = pNVar1;
      }
      return;
    }
    line = 0x377;
  }
  else {
    line = 0x376;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

PROTOBUF_NOINLINE void MergeIntoEmpty(NodeBase* head, size_t num_nodes) {
    ABSL_DCHECK_EQ(size(), size_t{0});
    ABSL_DCHECK_NE(num_nodes, size_t{0});
    if (const map_index_t needed_capacity = CalculateCapacityForSize(num_nodes);
        needed_capacity != this->num_buckets_) {
      Resize(std::max(kMinTableSize, needed_capacity));
    }
    num_elements_ = num_nodes;
    AssertLoadFactor();
    while (head != nullptr) {
      KeyNode* node = static_cast<KeyNode*>(head);
      head = head->next;
      absl::PrefetchToLocalCacheNta(head);
      InsertUnique(BucketNumber(TS::ToView(node->key())), node);
    }
  }